

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * absl::lts_20250127::StrCat<google::protobuf::Edition>
                   (string *__return_storage_ptr__,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
                   AlphaNum *e,Edition *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  StringifySink local_88;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  string_view local_18;
  
  local_68 = (a->piece_)._M_len;
  pcStack_60 = (a->piece_)._M_str;
  local_58 = (b->piece_)._M_len;
  pcStack_50 = (b->piece_)._M_str;
  local_48 = (c->piece_)._M_len;
  pcStack_40 = (c->piece_)._M_str;
  local_38 = (d->piece_)._M_len;
  pcStack_30 = (d->piece_)._M_str;
  local_28 = (e->piece_)._M_len;
  pcStack_20 = (e->piece_)._M_str;
  paVar1 = &local_88.buffer_.field_2;
  local_88.buffer_.field_2._M_allocated_capacity = 0;
  local_88.buffer_.field_2._8_8_ = 0;
  local_88.buffer_._M_string_length = 0;
  local_88.buffer_._M_dataplus._M_p = (pointer)paVar1;
  local_18 = strings_internal::ExtractStringification<google::protobuf::Edition>(&local_88,args);
  pieces._M_len = (size_type)paVar1;
  pieces._M_array = (iterator)0x6;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_68,pieces);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}